

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

xmlNodePtr xmlNewDocNodeEatName(xmlDocPtr doc,xmlNsPtr ns,xmlChar *name,xmlChar *content)

{
  int iVar1;
  xmlNodePtr pxVar2;
  xmlNodePtr pxVar3;
  _xmlNode *p_Var4;
  
  pxVar2 = xmlNewNodeEatName(ns,name);
  if (pxVar2 == (xmlNodePtr)0x0) {
    if (doc != (xmlDocPtr)0x0 && name != (xmlChar *)0x0) {
      iVar1 = xmlDictOwns(doc->dict,name);
      if (iVar1 == 0) {
        (*xmlFree)(name);
      }
    }
  }
  else {
    pxVar2->doc = doc;
    if (content != (xmlChar *)0x0) {
      pxVar3 = xmlStringGetNodeList(doc,content);
      pxVar2->children = pxVar3;
      if (pxVar3 == (xmlNodePtr)0x0) {
        pxVar2->last = (_xmlNode *)0x0;
      }
      else {
        do {
          p_Var4 = pxVar3;
          p_Var4->parent = pxVar2;
          pxVar3 = p_Var4->next;
        } while (p_Var4->next != (_xmlNode *)0x0);
        pxVar2->last = p_Var4;
      }
    }
  }
  return pxVar2;
}

Assistant:

xmlNodePtr
xmlNewDocNodeEatName(xmlDocPtr doc, xmlNsPtr ns,
              xmlChar *name, const xmlChar *content) {
    xmlNodePtr cur;

    cur = xmlNewNodeEatName(ns, name);
    if (cur != NULL) {
        cur->doc = doc;
	if (content != NULL) {
	    cur->children = xmlStringGetNodeList(doc, content);
	    UPDATE_LAST_CHILD_AND_PARENT(cur)
	}
    } else {
        /* if name don't come from the doc dictionary free it here */
        if ((name != NULL) && (doc != NULL) &&
	    (!(xmlDictOwns(doc->dict, name))))
	    xmlFree(name);
    }
    return(cur);
}